

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue
          (ZETHandleLifetimeValidation *this,zet_context_handle_t hContext,
          zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,zet_metric_tracer_exp_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  ze_result_t zVar6;
  ulong uVar7;
  zet_context_handle_t local_38;
  
  lVar1 = context;
  local_38 = hContext;
  iVar2 = std::
          _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x50),&local_38);
  zVar6 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if ((iVar2.
       super__Node_iterator_base<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (local_38 = (zet_context_handle_t)hDevice,
     iVar3 = std::
             _Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(*(long *)(lVar1 + 0xd48) + 0xc0),(key_type *)&local_38),
     iVar3.
     super__Node_iterator_base<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    if (metricGroupCount != 0 && phMetricGroups != (zet_metric_group_handle_t *)0x0) {
      uVar7 = 0;
      do {
        local_38 = (zet_context_handle_t)phMetricGroups[uVar7];
        iVar4 = std::
                _Hashtable<_zet_metric_group_handle_t_*,_std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_group_handle_t_*>,_std::hash<_zet_metric_group_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<_zet_metric_group_handle_t_*,_std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_group_handle_t_*>,_std::hash<_zet_metric_group_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(*(long *)(lVar1 + 0xd48) + 0x600),(key_type *)&local_38);
        if (iVar4.
            super__Node_iterator_base<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < metricGroupCount);
    }
    if (hNotificationEvent != (ze_event_handle_t)0x0) {
      local_38 = (zet_context_handle_t)hNotificationEvent;
      iVar5 = std::
              _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(*(long *)(lVar1 + 0xd48) + 0x1d8),(key_type *)&local_38);
      if (iVar5.
          super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      }
    }
    zVar6 = ZE_RESULT_SUCCESS;
  }
  return zVar6;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phMetricGroups) && (i < metricGroupCount ); ++i){
            if (!context.handleLifetime->isHandleValid( phMetricGroups[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        if (hNotificationEvent && !context.handleLifetime->isHandleValid( hNotificationEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }